

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void TransformOne_C(int16_t *in,uint8_t *dst)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  int iVar9;
  int iVar12;
  int iVar13;
  undefined1 auVar10 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar20;
  int iVar21;
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  int iVar22;
  int iVar27;
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  undefined8 uStack_48;
  int C [16];
  undefined2 uVar11;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  uVar1 = *(ulong *)in;
  uVar11 = (undefined2)(uVar1 >> 0x30);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10._12_2_ = uVar11;
  auVar10._14_2_ = uVar11;
  uVar11 = (undefined2)(uVar1 >> 0x20);
  auVar37._12_4_ = auVar10._12_4_;
  auVar37._8_2_ = 0;
  auVar37._0_8_ = uVar1;
  auVar37._10_2_ = uVar11;
  auVar31._10_6_ = auVar37._10_6_;
  auVar31._8_2_ = uVar11;
  auVar31._0_8_ = uVar1;
  uVar11 = (undefined2)(uVar1 >> 0x10);
  auVar3._4_8_ = auVar31._8_8_;
  auVar3._2_2_ = uVar11;
  auVar3._0_2_ = uVar11;
  iVar12 = auVar3._0_4_ >> 0x10;
  iVar13 = auVar31._8_4_ >> 0x10;
  uVar2 = *(undefined8 *)(in + 8);
  auVar19._0_12_ = in_XMM2._0_12_;
  auVar19._12_2_ = in_XMM2._6_2_;
  auVar19._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = in_XMM2._0_10_;
  auVar18._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = in_XMM2._0_8_;
  auVar17._8_2_ = in_XMM2._4_2_;
  auVar4._4_8_ = auVar17._8_8_;
  auVar4._2_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar4._0_2_ = in_XMM2._2_2_;
  iVar20 = auVar4._0_4_ >> 0x10;
  iVar21 = auVar17._8_4_ >> 0x10;
  iVar14 = (int)(short)uVar2 + (int)(short)uVar1;
  iVar15 = iVar20 + iVar12;
  iVar16 = (auVar18._12_4_ >> 0x10) + (auVar37._12_4_ >> 0x10);
  iVar9 = (int)(short)uVar1 - (int)(short)uVar2;
  iVar12 = iVar12 - iVar20;
  iVar20 = (auVar37._12_4_ >> 0x10) - (auVar18._12_4_ >> 0x10);
  uVar1 = *(ulong *)(in + 4);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar1;
  auVar25._0_12_ = in_XMM3._0_12_;
  auVar25._12_2_ = in_XMM3._6_2_;
  auVar25._14_2_ = (short)(uVar1 >> 0x30);
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = in_XMM3._0_10_;
  auVar24._10_2_ = (short)(uVar1 >> 0x20);
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = in_XMM3._0_8_;
  auVar23._8_2_ = in_XMM3._4_2_;
  auVar5._4_8_ = auVar23._8_8_;
  auVar5._2_2_ = (short)(uVar1 >> 0x10);
  auVar5._0_2_ = in_XMM3._2_2_;
  auVar26._0_4_ = (int)(short)uVar1;
  auVar26._4_4_ = auVar5._0_4_ >> 0x10;
  auVar26._8_4_ = auVar23._8_4_ >> 0x10;
  auVar26._12_4_ = auVar24._12_4_ >> 0x10;
  auVar29._4_4_ = auVar26._4_4_;
  auVar29._0_4_ = auVar26._4_4_;
  auVar29._8_4_ = auVar26._12_4_;
  auVar29._12_4_ = auVar26._12_4_;
  auVar37 = pmulhw(auVar36,_s__N_N_N_N_001b6890);
  auVar40._0_12_ = auVar37._0_12_;
  auVar40._12_2_ = auVar37._6_2_;
  auVar40._14_2_ = auVar37._6_2_;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar37._0_10_;
  auVar39._10_2_ = auVar37._4_2_;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar37._0_8_;
  auVar38._8_2_ = auVar37._4_2_;
  auVar6._4_8_ = auVar38._8_8_;
  auVar6._2_2_ = auVar37._2_2_;
  auVar6._0_2_ = auVar37._2_2_;
  uVar1 = *(ulong *)(in + 0xc);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1;
  iVar42 = (int)(short)(uVar1 >> 0x10);
  iVar43 = (int)(short)(uVar1 >> 0x20);
  iVar44 = (int)(short)(uVar1 >> 0x30);
  auVar31 = pmulhw(auVar30,_s__N_N_N_N_001b6890);
  auVar34._0_12_ = auVar31._0_12_;
  auVar34._12_2_ = auVar31._6_2_;
  auVar34._14_2_ = auVar31._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar31._0_10_;
  auVar33._10_2_ = auVar31._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar31._0_8_;
  auVar32._8_2_ = auVar31._4_2_;
  auVar7._4_8_ = auVar32._8_8_;
  auVar7._2_2_ = auVar31._2_2_;
  auVar7._0_2_ = auVar31._2_2_;
  iVar22 = (auVar26._0_4_ * 0x8a8c >> 0x10) - ((int)auVar31._0_2_ + (int)(short)uVar1);
  iVar27 = (auVar26._4_4_ * 0x8a8c >> 0x10) - ((auVar7._0_4_ >> 0x10) + iVar42);
  iVar28 = ((int)((auVar29._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) -
           ((auVar33._12_4_ >> 0x10) + iVar44);
  auVar35._4_4_ = iVar42;
  auVar35._0_4_ = iVar42;
  auVar35._8_4_ = iVar44;
  auVar35._12_4_ = iVar44;
  iVar44 = ((short)uVar1 * 0x8a8c >> 0x10) + auVar37._0_2_ + auVar26._0_4_;
  iVar42 = (iVar42 * 0x8a8c >> 0x10) + (auVar6._0_4_ >> 0x10) + auVar26._4_4_;
  iVar41 = ((int)((auVar35._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) +
           (auVar39._12_4_ >> 0x10) + auVar26._12_4_;
  C[0xc] = iVar41 + iVar16;
  C[0xd] = iVar28 + iVar20;
  C[0xf] = iVar16 - iVar41;
  C[0xe] = iVar20 - iVar28;
  C[8] = (iVar13 - iVar21) -
         (((int)((auVar26._8_8_ & 0xffffffff) * 0x8a8c) >> 0x10) -
         ((auVar32._8_4_ >> 0x10) + iVar43));
  C[9] = (iVar21 + iVar13) - ((iVar43 * 0x8a8c >> 0x10) + (auVar38._8_4_ >> 0x10) + auVar26._8_4_);
  C[4] = iVar42 + iVar15;
  C[5] = iVar27 + iVar12;
  C[6] = iVar12 - iVar27;
  C[7] = iVar15 - iVar42;
  uStack_48 = CONCAT44(iVar22 + iVar9,iVar44 + iVar14);
  C[0] = iVar9 - iVar22;
  C[1] = iVar14 - iVar44;
  lVar8 = 0;
  do {
    iVar9 = *(int *)((long)C + lVar8 + -8);
    iVar12 = *(int *)((long)C + lVar8 + 8);
    iVar13 = *(int *)((long)C + lVar8 + 0x18);
    iVar14 = iVar9 + iVar13 + 4;
    iVar20 = *(int *)((long)C + lVar8 + 0x28);
    iVar16 = (iVar20 * 0x8a8c >> 0x10) + (iVar12 * 0x4e7b >> 0x10) + iVar12;
    iVar15 = (iVar16 + iVar14 >> 3) + (uint)dst[lVar8 * 8];
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    if (0xfe < iVar15) {
      iVar15 = 0xff;
    }
    iVar13 = (iVar9 + 4) - iVar13;
    iVar12 = (iVar12 * 0x8a8c >> 0x10) - ((iVar20 * 0x4e7b >> 0x10) + iVar20);
    dst[lVar8 * 8] = (uint8_t)iVar15;
    iVar9 = (iVar12 + iVar13 >> 3) + (uint)dst[lVar8 * 8 + 1];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 1] = (uint8_t)iVar9;
    iVar9 = (iVar13 - iVar12 >> 3) + (uint)dst[lVar8 * 8 + 2];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 2] = (uint8_t)iVar9;
    iVar9 = (iVar14 - iVar16 >> 3) + (uint)dst[lVar8 * 8 + 3];
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    dst[lVar8 * 8 + 3] = (uint8_t)iVar9;
    lVar8 = lVar8 + 4;
  } while ((int)lVar8 != 0x10);
  return;
}

Assistant:

static void TransformOne_C(const int16_t* WEBP_RESTRICT in,
                           uint8_t* WEBP_RESTRICT dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];    // [-4096, 4094]
    const int b = in[0] - in[8];    // [-4095, 4095]
    const int c = WEBP_TRANSFORM_AC3_MUL2(in[4]) -
                  WEBP_TRANSFORM_AC3_MUL1(in[12]);  // [-3783, 3783]
    const int d = WEBP_TRANSFORM_AC3_MUL1(in[4]) +
                  WEBP_TRANSFORM_AC3_MUL2(in[12]);  // [-3785, 3781]
    tmp[0] = a + d;   // [-7881, 7875]
    tmp[1] = b + c;   // [-7878, 7878]
    tmp[2] = b - c;   // [-7878, 7878]
    tmp[3] = a - d;   // [-7877, 7879]
    tmp += 4;
    in++;
  }
  // Each pass is expanding the dynamic range by ~3.85 (upper bound).
  // The exact value is (2. + (20091 + 35468) / 65536).
  // After the second pass, maximum interval is [-3794, 3794], assuming
  // an input in [-2048, 2047] interval. We then need to add a dst value
  // in the [0, 255] range.
  // In the worst case scenario, the input to clip_8b() can be as large as
  // [-60713, 60968].
  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a =  dc +  tmp[8];
    const int b =  dc -  tmp[8];
    const int c =
        WEBP_TRANSFORM_AC3_MUL2(tmp[4]) - WEBP_TRANSFORM_AC3_MUL1(tmp[12]);
    const int d =
        WEBP_TRANSFORM_AC3_MUL1(tmp[4]) + WEBP_TRANSFORM_AC3_MUL2(tmp[12]);
    STORE(0, 0, a + d);
    STORE(1, 0, b + c);
    STORE(2, 0, b - c);
    STORE(3, 0, a - d);
    tmp++;
    dst += BPS;
  }
}